

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall
baryonyx::details::ap_file_observer::make_observation<double>
          (ap_file_observer *this,sparse_matrix<int> *ap,double *P,double *param_3)

{
  pointer pfVar1;
  int iVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  ofstream ofs;
  undefined1 local_288 [16];
  string local_278;
  ostream_iterator<double,_char,_std::char_traits<char>_> local_258;
  ulong local_248;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_248 = (ulong)(uint)this->m_frame;
  this->m_frame = this->m_frame + 1;
  local_258._M_stream = (ostream_type *)(this->m_basename)._M_dataplus._M_p;
  local_258._M_string = (char *)(this->m_basename)._M_string_length;
  format_str.size_ = 0x1d;
  format_str.data_ = (char *)0xb;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_258;
  ::fmt::v7::detail::vformat_abi_cxx11_(&local_278,(detail *)"{}-P-{}.txt",format_str,args);
  std::ofstream::ofstream(&local_230,(string *)&local_278,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (this->constraints != 0) {
    iVar2 = 0;
    do {
      if (0 < (long)this->variables) {
        memset((this->m_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,0,(long)this->variables << 2);
      }
      sparse_matrix<int>::row((sparse_matrix<int> *)local_288,(int)ap);
      if (local_288._8_8_ != local_288._0_8_) {
        pfVar1 = (this->m_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pfVar1[*(int *)(local_288._8_8_ + 4)] = (float)P[*(int *)local_288._8_8_];
          local_288._8_8_ = local_288._8_8_ + 8;
        } while (local_288._8_8_ != local_288._0_8_);
      }
      local_258._M_string = " ";
      local_258._M_stream = (ostream_type *)&local_230;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<float*,std::ostream_iterator<double,char,std::char_traits<char>>>
                ((__copy_move<false,false,std::random_access_iterator_tag> *)&local_278,
                 (this->m_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->m_value).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_258);
      local_258._M_stream = (ostream_type *)CONCAT71(local_258._M_stream._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,(char *)&local_258,1)
      ;
      iVar2 = iVar2 + 1;
    } while (iVar2 != this->constraints);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& ap,
                          const Float* P,
                          const Float* /*pi*/)
    {
        static_assert(std::is_floating_point<Float>::value);

        std::ofstream ofs(fmt::format("{}-P-{}.txt", m_basename, m_frame++));

        for (int k = 0; k != constraints; ++k) {
            std::fill_n(std::begin(m_value), variables, 0.0f);

            auto [it, et] = ap.row(k);
            for (; it != et; ++it)
                m_value[it->column] = static_cast<float>(P[it->value]);

            std::copy(m_value.begin(),
                      m_value.end(),
                      std::ostream_iterator<Float>(ofs, " "));

            ofs << '\n';
        }
    }